

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_time.h
# Opt level: O3

void stm_setup(void)

{
  timespec ts;
  timespec local_18;
  
  _stm._4_12_ = SUB1612(ZEXT816(0),4);
  _stm.initialized = 0xabcdabcd;
  clock_gettime(1,&local_18);
  _stm.start = local_18.tv_sec * 1000000000 + local_18.tv_nsec;
  return;
}

Assistant:

SOKOL_API_IMPL void stm_setup(void) {
    memset(&_stm, 0, sizeof(_stm));
    _stm.initialized = 0xABCDABCD;
    #if defined(_WIN32)
        QueryPerformanceFrequency(&_stm.freq);
        QueryPerformanceCounter(&_stm.start);
    #elif defined(__APPLE__) && defined(__MACH__)
        mach_timebase_info(&_stm.timebase);
        _stm.start = mach_absolute_time();
    #elif defined(__EMSCRIPTEN__)
        _stm.start = stm_js_perfnow();
    #else
        struct timespec ts;
        clock_gettime(CLOCK_MONOTONIC, &ts);
        _stm.start = (uint64_t)ts.tv_sec*1000000000 + (uint64_t)ts.tv_nsec;
    #endif
}